

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O0

void __thiscall ThrowStatement::GenerateCode(ThrowStatement *this,ostream *out,int n)

{
  ostream *poVar1;
  shared_ptr<Expression> local_48;
  expression_out local_38;
  indent local_20;
  int local_1c;
  ostream *poStack_18;
  int n_local;
  ostream *out_local;
  ThrowStatement *this_local;
  
  local_1c = n;
  poStack_18 = out;
  out_local = (ostream *)this;
  indent::indent(&local_20,n);
  poVar1 = operator<<(out,&local_20);
  poVar1 = std::operator<<(poVar1,"throw ");
  std::shared_ptr<Expression>::shared_ptr(&local_48,&this->m_Expression);
  expression_out::expression_out(&local_38,&local_48,local_1c);
  poVar1 = operator<<(poVar1,&local_38);
  poVar1 = std::operator<<(poVar1,';');
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  expression_out::~expression_out(&local_38);
  std::shared_ptr<Expression>::~shared_ptr(&local_48);
  return;
}

Assistant:

virtual void GenerateCode( std::ostream& out, int n ) const
	{
		out << ::indent(n) << "throw " << expression_out(m_Expression, n) << ';' << std::endl;
	}